

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Routines_Disasm.c
# Opt level: O1

void vex_ExGx(PDISASM pMyDisasm)

{
  UInt8 UVar1;
  UInt8 UVar2;
  int iVar3;
  Int32 IVar4;
  Int32 IVar5;
  
  UVar1 = (pMyDisasm->Reserved_).EVEX.state;
  if (UVar1 == '\x01') {
    UVar2 = (pMyDisasm->Reserved_).EVEX.vvvv;
  }
  else {
    UVar2 = (pMyDisasm->Reserved_).VEX.vvvv;
  }
  if (UVar2 != '\x0f') {
    (pMyDisasm->Reserved_).ERROR_OPCODE = 2;
  }
  UVar2 = (pMyDisasm->Reserved_).VEX.L;
  if (UVar2 == '\x01') {
    iVar3 = (uint)(UVar1 == '\x01') * 0x20000 + 0x120000;
    IVar4 = 10;
    IVar5 = 8;
  }
  else if (UVar2 == '\0') {
    iVar3 = 0x110000;
    if (UVar1 == '\x01') {
      iVar3 = 0x140000;
    }
    IVar4 = 9;
    IVar5 = 4;
  }
  else {
    if ((pMyDisasm->Reserved_).EVEX.LL != '\x02') {
      return;
    }
    IVar4 = 0xe;
    IVar5 = 0x10;
    iVar3 = 0x140000;
  }
  (pMyDisasm->Instruction).Category = iVar3;
  (pMyDisasm->Reserved_).Register_ = IVar5;
  (pMyDisasm->Reserved_).MemDecoration = IVar4;
  decodeModrm(&pMyDisasm->Operand1,pMyDisasm);
  decodeRegOpcode(&pMyDisasm->Operand2,pMyDisasm);
  (pMyDisasm->Reserved_).EIP_ =
       (pMyDisasm->Reserved_).EIP_ + (ulong)((pMyDisasm->Reserved_).DECALAGE_EIP + 2);
  return;
}

Assistant:

void __bea_callspec__ vex_ExGx(PDISASM pMyDisasm)
{
  verifyVEXvvvv(pMyDisasm);
  if (GV.VEX.L == 0) {
    pMyDisasm->Instruction.Category = (GV.EVEX.state == InUsePrefix) ? AVX512_INSTRUCTION : AVX_INSTRUCTION;
    GV.Register_ = SSE_REG;
    GV.MemDecoration = Arg1_m128_xmm;
    ExGx(pMyDisasm);
  }
  else if (GV.VEX.L == 0x1) {
    pMyDisasm->Instruction.Category = (GV.EVEX.state == InUsePrefix) ? AVX512_INSTRUCTION : AVX2_INSTRUCTION;
    GV.Register_ = AVX_REG;
    GV.MemDecoration = Arg1_m256_ymm;
    ExGx(pMyDisasm);
  }
  else if (GV.EVEX.LL == 0x2) {
    pMyDisasm->Instruction.Category = AVX512_INSTRUCTION;
    GV.Register_ = AVX512_REG;
    GV.MemDecoration = Arg1_m512_zmm;
    ExGx(pMyDisasm);
  }
}